

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precision.cpp
# Opt level: O2

void verify_accuracy_all<float,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                rng)

{
  ostream *poVar1;
  long lVar2;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmVar3;
  unsigned_long *puVar4;
  byte bVar5;
  float fVar6;
  initializer_list<distribution<float>_> __l;
  unsigned_long auStack_aa8 [313];
  allocator_type local_d9;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> dists;
  _Vector_base<distribution<float>,_std::allocator<distribution<float>_>_> local_c0;
  _Vector_base<distribution<float>,_std::allocator<distribution<float>_>_> local_a8;
  _Vector_base<distribution<float>,_std::allocator<distribution<float>_>_> local_90;
  _Vector_base<distribution<float>,_std::allocator<distribution<float>_>_> local_78;
  _Vector_base<distribution<float>,_std::allocator<distribution<float>_>_> local_60;
  distribution<float> local_48;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  bVar5 = 0;
  local_28 = 10;
  uStack_20 = 0x3f800000;
  local_48.deviation = 1.0;
  local_48._20_4_ = 0;
  uStack_30 = 20000000;
  local_48.terms = 20000000;
  local_48.mean = 0;
  __l._M_len = 2;
  __l._M_array = &local_48;
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&dists,__l,&local_d9);
  poVar1 = std::operator<<((ostream *)&std::cout,"testing for ");
  poVar1 = std::operator<<(poVar1,_Init + (*_Init == '*'));
  poVar1 = std::operator<<(poVar1,":");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"kahan:    ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            ((vector<distribution<float>,_std::allocator<distribution<float>_>_> *)&local_60,&dists)
  ;
  pmVar3 = &rng;
  puVar4 = auStack_aa8;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = pmVar3->_M_x[0];
    pmVar3 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)((long)pmVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  fVar6 = verify_accuracy<float,sumlib::kahan,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_60);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>::~_Vector_base
            (&local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,"neumaier: ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            ((vector<distribution<float>,_std::allocator<distribution<float>_>_> *)&local_78,&dists)
  ;
  pmVar3 = &rng;
  puVar4 = auStack_aa8;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = pmVar3->_M_x[0];
    pmVar3 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)((long)pmVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  fVar6 = verify_accuracy<float,sumlib::neumaier,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_78);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>::~_Vector_base
            (&local_78);
  poVar1 = std::operator<<((ostream *)&std::cout,"naive:    ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            ((vector<distribution<float>,_std::allocator<distribution<float>_>_> *)&local_90,&dists)
  ;
  pmVar3 = &rng;
  puVar4 = auStack_aa8;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = pmVar3->_M_x[0];
    pmVar3 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)((long)pmVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  fVar6 = verify_accuracy<float,sumlib::naive,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_90);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>::~_Vector_base
            (&local_90);
  poVar1 = std::operator<<((ostream *)&std::cout,"sorted:   ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            ((vector<distribution<float>,_std::allocator<distribution<float>_>_> *)&local_a8,&dists)
  ;
  pmVar3 = &rng;
  puVar4 = auStack_aa8;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = pmVar3->_M_x[0];
    pmVar3 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)((long)pmVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  fVar6 = verify_accuracy<float,sumlib::sorted,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_a8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>::~_Vector_base
            (&local_a8);
  poVar1 = std::operator<<((ostream *)&std::cout,"rsorted:  ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            ((vector<distribution<float>,_std::allocator<distribution<float>_>_> *)&local_c0,&dists)
  ;
  pmVar3 = &rng;
  puVar4 = auStack_aa8;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = pmVar3->_M_x[0];
    pmVar3 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)((long)pmVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  fVar6 = verify_accuracy<float,sumlib::rsorted,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_c0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>::~_Vector_base
            (&local_c0);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>::~_Vector_base
            (&dists.super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>);
  return;
}

Assistant:

void verify_accuracy_all( RNG rng ) {
    const vector<distribution<T>> dists = {
        {20*1000*1000, 0, 1},
        {20*1000*1000, 10, 1},
    };

    cout << "testing for " << typeid(T).name() << ":" << endl;
    cout << "kahan:    " << verify_accuracy<T, kahan>   ( dists, rng ) << endl;
    cout << "neumaier: " << verify_accuracy<T, neumaier>( dists, rng ) << endl;
    cout << "naive:    " << verify_accuracy<T, naive>   ( dists, rng ) << endl;
    cout << "sorted:   " << verify_accuracy<T, sorted>  ( dists, rng ) << endl;
    cout << "rsorted:  " << verify_accuracy<T, rsorted> ( dists, rng ) << endl;

    cout << endl;
}